

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  long lVar1;
  ostream *poVar2;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var3;
  char *local_40;
  long local_38;
  char local_30;
  undefined7 uStack_2f;
  
  _Var3._M_head_impl =
       (root->comments_).ptr_._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  if (_Var3._M_head_impl !=
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0) {
    if (*(size_type *)((long)(_Var3._M_head_impl)->_M_elems + 0x28) != 0) {
      local_40 = (char *)CONCAT71(local_40._1_7_,0x20);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->document_,(char *)&local_40,1);
      _Var3._M_head_impl =
           (root->comments_).ptr_._M_t.
           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           .
           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           ._M_head_impl;
      if (_Var3._M_head_impl ==
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) {
        local_40 = &local_30;
        local_38 = 0;
        local_30 = '\0';
      }
      else {
        local_40 = &local_30;
        lVar1 = *(long *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)(_Var3._M_head_impl)->_M_elems + 0x20))->_M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_40,lVar1,
                   *(size_type *)((long)(_Var3._M_head_impl)->_M_elems + 0x28) + lVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_40,local_38);
      if (local_40 != &local_30) {
        operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
      }
      _Var3._M_head_impl =
           (root->comments_).ptr_._M_t.
           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           .
           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           ._M_head_impl;
      if (_Var3._M_head_impl ==
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) goto LAB_001148a6;
    }
    if ((_Var3._M_head_impl)->_M_elems[2]._M_string_length != 0) {
      writeIndent(this);
      poVar2 = this->document_;
      _Var3._M_head_impl =
           (root->comments_).ptr_._M_t.
           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           .
           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           ._M_head_impl;
      if (_Var3._M_head_impl ==
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) {
        local_40 = &local_30;
        local_38 = 0;
        local_30 = '\0';
      }
      else {
        local_40 = &local_30;
        lVar1 = *(long *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)(_Var3._M_head_impl)->_M_elems + 0x40))->_M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_40,lVar1,
                   *(size_type *)((long)(_Var3._M_head_impl)->_M_elems + 0x48) + lVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_40,local_38);
      if (local_40 != &local_30) {
        operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
      }
    }
  }
LAB_001148a6:
  this->field_0x68 = this->field_0x68 & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << ' ' << root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *document_ << root.getComment(commentAfter);
  }
  indented_ = false;
}